

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O2

bool __thiscall tcu::TestSessionExecutor::iterate(TestSessionExecutor *this)

{
  TestHierarchyIterator *this_00;
  bool bVar1;
  State SVar2;
  IterateResult IVar3;
  string *casePath;
  TestNode *pTVar4;
  
  this_00 = &this->m_iterator;
  do {
    while( true ) {
      if (this->m_abortSession != false) {
        return false;
      }
      if (this->m_state != STATE_TRAVERSE_HIERARCHY) break;
      SVar2 = TestHierarchyIterator::getState(this_00);
      if (STATE_LEAVE_NODE < SVar2) {
        (this->m_status).isComplete = true;
        return false;
      }
      pTVar4 = TestHierarchyIterator::getNode(this_00);
      if (pTVar4->m_nodeType - NODETYPE_SELF_VALIDATE < 4) {
        if (SVar2 == STATE_ENTER_NODE) {
          casePath = TestHierarchyIterator::getNodePath_abi_cxx11_(this_00);
          bVar1 = enterTestCase(this,(TestCase *)pTVar4,casePath);
          if (bVar1) {
            this->m_state = STATE_EXECUTE_TEST_CASE;
          }
        }
        else {
          leaveTestCase(this,(TestCase *)pTVar4);
        }
      }
      else if (pTVar4->m_nodeType == NODETYPE_PACKAGE) {
        if (SVar2 == STATE_ENTER_NODE) {
          enterTestPackage(this,(TestPackage *)pTVar4);
        }
        else {
          de::details::UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>
          ::reset(&(this->m_caseExecutor).
                   super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>
                 );
        }
      }
      TestHierarchyIterator::next(this_00);
    }
  } while (this->m_state != STATE_EXECUTE_TEST_CASE);
  pTVar4 = TestHierarchyIterator::getNode(this_00);
  IVar3 = iterateTestCase(this,(TestCase *)pTVar4);
  if (IVar3 == STOP) {
    this->m_state = STATE_TRAVERSE_HIERARCHY;
  }
  return true;
}

Assistant:

bool TestSessionExecutor::iterate (void)
{
	while (!m_abortSession)
	{
		switch (m_state)
		{
			case STATE_TRAVERSE_HIERARCHY:
			{
				const TestHierarchyIterator::State	hierIterState	= m_iterator.getState();

				if (hierIterState == TestHierarchyIterator::STATE_ENTER_NODE ||
					hierIterState == TestHierarchyIterator::STATE_LEAVE_NODE)
				{
					TestNode* const		curNode		= m_iterator.getNode();
					const TestNodeType	nodeType	= curNode->getNodeType();
					const bool			isEnter		= hierIterState == TestHierarchyIterator::STATE_ENTER_NODE;

					switch (nodeType)
					{
						case NODETYPE_PACKAGE:
						{
							TestPackage* const testPackage = static_cast<TestPackage*>(curNode);
							isEnter ? enterTestPackage(testPackage) : leaveTestPackage(testPackage);
							break;
						}

						case NODETYPE_GROUP:
							break; // nada

						case NODETYPE_SELF_VALIDATE:
						case NODETYPE_PERFORMANCE:
						case NODETYPE_CAPABILITY:
						case NODETYPE_ACCURACY:
						{
							TestCase* const testCase = static_cast<TestCase*>(curNode);

							if (isEnter)
							{
								if (enterTestCase(testCase, m_iterator.getNodePath()))
									m_state = STATE_EXECUTE_TEST_CASE;
								// else remain in TRAVERSING_HIERARCHY => node will be exited from in the next iteration
							}
							else
								leaveTestCase(testCase);

							break;
						}

						default:
							DE_ASSERT(false);
							break;
					}

					m_iterator.next();
					break;
				}
				else
				{
					DE_ASSERT(hierIterState == TestHierarchyIterator::STATE_FINISHED);
					m_status.isComplete = true;
					return false;
				}
			}

			case STATE_EXECUTE_TEST_CASE:
			{
				DE_ASSERT(m_iterator.getState() == TestHierarchyIterator::STATE_LEAVE_NODE &&
						  isTestNodeTypeExecutable(m_iterator.getNode()->getNodeType()));

				TestCase* const					testCase	= static_cast<TestCase*>(m_iterator.getNode());
				const TestCase::IterateResult	iterResult	= iterateTestCase(testCase);

				if (iterResult == TestCase::STOP)
					m_state = STATE_TRAVERSE_HIERARCHY;

				return true;
			}

			default:
				DE_ASSERT(false);
				break;
		}
	}

	return false;
}